

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.h
# Opt level: O2

double brotli::ClusterCostDiff(size_t size_a,size_t size_b)

{
  size_t v;
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  v = size_b + size_a;
  auVar4._8_4_ = (int)(size_a >> 0x20);
  auVar4._0_8_ = size_a;
  auVar4._12_4_ = 0x45300000;
  dVar1 = FastLog2(size_a);
  auVar5._8_4_ = (int)(size_b >> 0x20);
  auVar5._0_8_ = size_b;
  auVar5._12_4_ = 0x45300000;
  dVar2 = FastLog2(size_b);
  auVar6._8_4_ = (int)(v >> 0x20);
  auVar6._0_8_ = v;
  auVar6._12_4_ = 0x45300000;
  dVar3 = FastLog2(v);
  return (dVar2 * ((auVar5._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)size_b) - 4503599627370496.0)) +
         dVar1 * ((auVar4._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)size_a) - 4503599627370496.0))) -
         dVar3 * ((auVar6._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)v) - 4503599627370496.0));
}

Assistant:

inline double ClusterCostDiff(size_t size_a, size_t size_b) {
  size_t size_c = size_a + size_b;
  return static_cast<double>(size_a) * FastLog2(size_a) +
      static_cast<double>(size_b) * FastLog2(size_b) -
      static_cast<double>(size_c) * FastLog2(size_c);
}